

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerInvulnerable::EndEffect(APowerInvulnerable *this)

{
  uint uVar1;
  int iVar2;
  AActor *pAVar3;
  
  APowerup::EndEffect(&this->super_APowerup);
  pAVar3 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar3 != (AActor *)0x0) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      uVar1 = (pAVar3->flags2).Value;
      (pAVar3->flags2).Value = uVar1 & 0xf7ffffff;
      *(byte *)&pAVar3->effects = (byte)pAVar3->effects & 0xdf;
      iVar2 = (this->super_APowerup).Mode.super_FName.Index;
      if (iVar2 == 0x12) {
        (pAVar3->flags2).Value = uVar1 & 0x77ffffff;
      }
      else if ((iVar2 == 0x11) &&
              ((pAVar3->flags2).Value = uVar1 & 0xf3ffffff, ((pAVar3->flags).Value & 0x40000) == 0))
      {
        pAVar3->RenderStyle = LegacyRenderStyles[1];
        pAVar3 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
        pAVar3->Alpha = 1.0;
      }
      if (pAVar3->player != (player_t *)0x0) {
        pAVar3->player->fixedcolormap = -1;
      }
    }
    else {
      (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    }
  }
  return;
}

Assistant:

void APowerInvulnerable::EndEffect ()
{
	Super::EndEffect();

	if (Owner == NULL)
	{
		return;
	}

	Owner->flags2 &= ~MF2_INVULNERABLE;
	Owner->effects &= ~FX_RESPAWNINVUL;
	if (Mode == NAME_Ghost)
	{
		Owner->flags2 &= ~MF2_NONSHOOTABLE;
		if (!(Owner->flags & MF_SHADOW))
		{
			// Don't mess with the translucency settings if an
			// invisibility powerup is active.
			Owner->RenderStyle = STYLE_Normal;
			Owner->Alpha = 1.;
		}
	}
	else if (Mode == NAME_Reflective)
	{
		Owner->flags2 &= ~MF2_REFLECTIVE;
	}

	if (Owner->player != NULL)
	{
		Owner->player->fixedcolormap = NOFIXEDCOLORMAP;
	}
}